

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_sig(uchar **p,uchar *end,mbedtls_x509_buf *sig)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  byte *local_18;
  
  local_18 = *p;
  if (end != local_18 && -1 < (long)end - (long)local_18) {
    sig->tag = (uint)*local_18;
    iVar2 = mbedtls_asn1_get_bitstring_null(p,end,(size_t *)&local_18);
    if (iVar2 == 0) {
      sig->len = (size_t)local_18;
      puVar1 = *p;
      sig->p = puVar1;
      *p = puVar1 + (long)local_18;
      iVar2 = 0;
    }
    else {
      iVar2 = iVar2 + -0x2480;
    }
    return iVar2;
  }
  return -0x24e0;
}

Assistant:

int mbedtls_x509_get_sig( unsigned char **p, const unsigned char *end, mbedtls_x509_buf *sig )
{
    int ret;
    size_t len;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    sig->tag = **p;

    if( ( ret = mbedtls_asn1_get_bitstring_null( p, end, &len ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_SIGNATURE + ret );

    sig->len = len;
    sig->p = *p;

    *p += len;

    return( 0 );
}